

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O1

BackTraceSymbol __thiscall
cppassert::internal::BackTraceSymbol::createFromBacktraceStr
          (BackTraceSymbol *this,char *backTraceSymbol,CppDemangler *demangler)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  CppDemangler *extraout_RDX;
  CppDemangler *extraout_RDX_00;
  CppDemangler *extraout_RDX_01;
  char *beginName;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  BackTraceSymbol BVar8;
  
  this->symbol_ = "<unkown>";
  this->allocated_ = (char *)0x0;
  pcVar3 = backTraceSymbol;
  pcVar4 = (char *)0x0;
  pcVar6 = (char *)0x0;
  do {
    cVar1 = *pcVar3;
    pcVar5 = pcVar3;
    pcVar7 = pcVar6;
    if ((cVar1 != '(') && (pcVar5 = pcVar4, pcVar7 = pcVar3, cVar1 != '+')) {
      if (cVar1 == '\0') {
        bVar2 = 0;
        goto LAB_001055b3;
      }
      pcVar7 = pcVar6;
      if (cVar1 == ')' && pcVar6 != (char *)0x0) break;
    }
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar5;
    pcVar6 = pcVar7;
  } while( true );
  bVar2 = 1;
LAB_001055b3:
  if ((bool)(pcVar4 < pcVar6 & bVar2 & (pcVar6 != (char *)0x0 && pcVar4 != (char *)0x0))) {
    *pcVar4 = '\0';
    *pcVar6 = '\0';
    pcVar3 = CppDemangler::demangle(demangler,pcVar4 + 1);
    if (pcVar3 != (char *)0x0) {
      setSymbol(this,backTraceSymbol,pcVar3,pcVar6 + 1);
      demangler = extraout_RDX_00;
      goto LAB_00105626;
    }
    *pcVar4 = '(';
    *pcVar6 = '+';
    demangler = extraout_RDX;
    if (this->allocated_ != (char *)0x0) {
      free(this->allocated_);
      this->allocated_ = (char *)0x0;
      demangler = extraout_RDX_01;
    }
  }
  this->symbol_ = backTraceSymbol;
LAB_00105626:
  BVar8.allocated_ = (char *)demangler;
  BVar8.symbol_ = (char *)this;
  return BVar8;
}

Assistant:

static BackTraceSymbol createFromBacktraceStr(char *backTraceSymbol
                                        , CppDemangler *demangler)
    {
        BackTraceSymbol result;
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;
        findSymbolInBacktraceStr(backTraceSymbol
                                , &beginName
                                , &beginOffset
                                , &endOffset);

        if (beginName
            && beginOffset
            && endOffset
	    && beginName < beginOffset)
	{
	    *beginName++ = '\0';
            *beginOffset++ = '\0';
            const char *demangledSymbol = demangler->demangle(beginName);
            if(demangledSymbol)
            {
                result.setSymbol(backTraceSymbol, demangledSymbol, beginOffset);
            }
            else
            {
                //restore previous state
                --beginName;
                --beginOffset;
                *beginName = '(';
                *beginOffset = '+';
                result.setSymbol(backTraceSymbol);
            }
        }
        else
        {
            result.setSymbol(backTraceSymbol);
        }

        return result;
    }